

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxOutIndexWithOffsetByHandle
              (void *handle,void *tx_data_handle,uint32_t offset,char *address,
              char *direct_locking_script,uint32_t *index)

{
  uint uVar1;
  ConfidentialTransactionContext *this;
  bool bVar2;
  iterator __begin3;
  pointer puVar3;
  CfdException *pCVar4;
  bool is_bitcoin;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  string addr_str;
  ElementsAddressFactory address_factory;
  Address addr;
  Address addr_1;
  Address local_1a8;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&addr,"TransactionData",(allocator *)&addr_1);
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  this = *(ConfidentialTransactionContext **)((long)tx_data_handle + 0x18);
  if (this == (ConfidentialTransactionContext *)0x0) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Invalid handle state. tx is null",(allocator *)&addr_1);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&addr);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin == true) {
    bVar2 = cfd::capi::IsEmptyString(direct_locking_script);
    if (bVar2) {
      bVar2 = cfd::capi::IsEmptyString(address);
      if (!bVar2) {
        std::__cxx11::string::string((string *)&addr_1,address,(allocator *)&local_1a8);
        cfd::core::Address::Address(&addr,(string *)&addr_1);
        std::__cxx11::string::~string((string *)&addr_1);
        cfd::TransactionContext::IsFindTxOut((TransactionContext *)this,&addr,index,&indexes);
        cfd::core::Address::~Address(&addr);
      }
    }
    else {
      std::__cxx11::string::string((string *)&addr_1,direct_locking_script,(allocator *)&local_1a8);
      cfd::core::Script::Script((Script *)&addr,(string *)&addr_1);
      cfd::TransactionContext::IsFindTxOut
                ((TransactionContext *)this,(Script *)&addr,index,&indexes);
LAB_003a3046:
      cfd::core::Script::~Script((Script *)&addr);
      std::__cxx11::string::~string((string *)&addr_1);
    }
  }
  else {
    bVar2 = cfd::capi::IsEmptyString(direct_locking_script);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&addr_1,direct_locking_script,(allocator *)&local_1a8);
      cfd::core::Script::Script((Script *)&addr,(string *)&addr_1);
      cfd::ConfidentialTransactionContext::IsFindTxOut(this,(Script *)&addr,index,&indexes);
      goto LAB_003a3046;
    }
    bVar2 = cfd::capi::IsEmptyString(address);
    if (bVar2) {
      addr._0_8_ = addr._0_8_ & 0xffffffff00000000;
      bVar2 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut(this,(uint32_t *)&addr);
      if ((bVar2) && (offset <= (uint)addr.type_)) {
        if (index != (uint32_t *)0x0) {
          *index = addr.type_;
        }
        goto LAB_003a308b;
      }
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory(&address_factory);
      std::__cxx11::string::string((string *)&addr_str,address,(allocator *)&addr);
      cfd::core::Address::Address(&addr_1);
      bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&addr_str);
      if (bVar2) {
        cfd::ElementsAddressFactory::GetConfidentialAddress
                  ((ElementsConfidentialAddress *)&addr,&address_factory,&addr_str);
        cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
                  (&local_1a8,(ElementsConfidentialAddress *)&addr);
        cfd::core::Address::operator=(&addr_1,&local_1a8);
        cfd::core::Address::~Address(&local_1a8);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)&addr);
      }
      else {
        cfd::AddressFactory::GetAddress(&addr,&address_factory.super_AddressFactory,&addr_str);
        cfd::core::Address::operator=(&addr_1,&addr);
        cfd::core::Address::~Address(&addr);
      }
      cfd::ConfidentialTransactionContext::IsFindTxOut(this,&addr_1,index,&indexes);
      cfd::core::Address::~Address(&addr_1);
      std::__cxx11::string::~string((string *)&addr_str);
      cfd::AddressFactory::~AddressFactory(&address_factory.super_AddressFactory);
    }
  }
  puVar3 = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_003a31a4:
    if (index != (uint32_t *)0x0) {
      *index = 0;
    }
    if (offset == 0) {
      addr._0_8_ = (long)
                   "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                   + 0x56;
      addr.witness_ver_ = 0x101c;
      addr.address_._M_dataplus._M_p = "CfdGetTxOutIndexWithOffsetByHandle";
      cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"target not found.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&addr,"Failed to parameter. search target is not found.",
                 (allocator *)&addr_1);
      cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&addr);
      __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 + 0x56;
    addr.witness_ver_ = 0x1021;
    addr.address_._M_dataplus._M_p = "CfdGetTxOutIndexWithOffsetByHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"target not found by offset.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"There are no targets after the offset.",(allocator *)&addr_1);
    cfd::core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)&addr);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  do {
    if (puVar3 == indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) goto LAB_003a31a4;
    uVar1 = *puVar3;
    puVar3 = puVar3 + 1;
  } while (uVar1 < offset);
  if (index != (uint32_t *)0x0) {
    *index = uVar1;
  }
LAB_003a308b:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return 0;
}

Assistant:

int CfdGetTxOutIndexWithOffsetByHandle(
    void* handle, void* tx_data_handle, uint32_t offset, const char* address,
    const char* direct_locking_script, uint32_t* index) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    std::vector<uint32_t> indexes;
    bool is_find = false;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (!IsEmptyString(direct_locking_script)) {
        tx->IsFindTxOut(Script(direct_locking_script), index, &indexes);
      } else if (!IsEmptyString(address)) {
        Address addr(address);
        tx->IsFindTxOut(addr, index, &indexes);
      } else {
        // do nothing
      }
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (!IsEmptyString(direct_locking_script)) {
        tx->IsFindTxOut(Script(direct_locking_script), index, &indexes);
      } else if (!IsEmptyString(address)) {
        ElementsAddressFactory address_factory;
        std::string addr_str(address);
        Address addr;
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr_str)) {
          addr = address_factory.GetConfidentialAddress(addr_str)
                     .GetUnblindedAddress();
        } else {
          addr = address_factory.GetAddress(addr_str);
        }
        tx->IsFindTxOut(addr, index, &indexes);
      } else {
        // fee
        uint32_t temp_index = 0;
        is_find = tx->IsFindFeeTxOut(&temp_index);
        if (is_find) {
          if (offset > temp_index)
            is_find = false;
          else if (index != nullptr)
            *index = temp_index;
        }
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if ((!is_find) && (!indexes.empty())) {
      for (const auto& work_index : indexes) {
        if (offset <= work_index) {
          is_find = true;
          if (index != nullptr) *index = work_index;
          break;
        }
      }
    }

    if (!is_find) {
      if (index != nullptr) *index = 0;
      if (offset == 0) {
        warn(CFD_LOG_SOURCE, "target not found.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. search target is not found.");
      } else {
        warn(CFD_LOG_SOURCE, "target not found by offset.");
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "There are no targets after the offset.");
      }
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}